

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,1,-1,false>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,-1,1,true>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  rStack_38;
  
  if (0 < *(long *)(this + 0x40)) {
    rStack_38.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
    .
    super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_Eigen::internal::IndexBased,_float>
    .m_argImpl.
    super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>.
    super_block_evaluator<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
    .m_data = *(PointerType *)this;
    rStack_38.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
    .
    super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_Eigen::internal::IndexBased,_float>
    .m_argImpl.
    super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>.
    super_block_evaluator<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
    .m_innerStride.m_value = *(long *)(*(long *)(this + 0x18) + 8);
    rStack_38.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.rhsImpl.
    super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
    .
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_data = *(PointerType *)(this + 0x38);
    rStack_38.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.rhsImpl.
    super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
    .
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = *(long *)(this + 0x58);
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,1,-1,false>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,-1,1,true>const>>,0,0>
            ::
            run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
                      (&rStack_38,func,
                       (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                        *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>, const Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, 1>>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>, const Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, 1>>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}